

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void amrex::Sleep(double sleepsec)

{
  int iVar1;
  int *piVar2;
  timespec __ts;
  timespec local_18;
  
  if (0.0 < sleepsec) {
    local_18.tv_sec = (__time_t)sleepsec;
    local_18.tv_nsec = (long)((sleepsec - (double)local_18.tv_sec) * 1000000000.0);
    do {
      iVar1 = nanosleep(&local_18,&local_18);
      if (iVar1 != -1) {
        return;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return;
}

Assistant:

void amrex::Sleep(double sleepsec) {
    std::this_thread::sleep_for(std::chrono::duration<double>(sleepsec));
}